

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConLaw.cpp
# Opt level: O2

char * KindToStrIO(NaControlLawKind k)

{
  if (k < __clkNumber) {
    return &DAT_0015b088 + *(int *)(&DAT_0015b088 + (ulong)k * 4);
  }
  return "?kind?";
}

Assistant:

const char*     KindToStrIO (NaControlLawKind k)
{
    switch(k)
    {
    case clkConstant:
        return "constant";
    case clkMeander:
        return "meander";
    case clkSine:
        return "sine";
    case clkSineSine:
        return "sine_sine";
    case clkPike:
        return "pike";
    default:
        return "?kind?";
    }
}